

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_avx.cpp
# Opt level: O2

int __thiscall ncnn::Deconvolution_x86_avx::create_pipeline(Deconvolution_x86_avx *this,Option *opt)

{
  uint uVar1;
  int *piVar2;
  long lVar3;
  Layer *pLVar4;
  undefined4 *puVar5;
  ulong uVar6;
  int p;
  int i_00;
  ulong uVar7;
  ulong uVar8;
  _func_int **pp_Var9;
  ulong uVar10;
  _func_int **pp_Var11;
  int q;
  int iVar12;
  long lVar13;
  _func_int *p_Var14;
  int k;
  _func_int **pp_Var15;
  int i;
  ulong uVar16;
  int _h;
  int iVar17;
  _func_int **pp_Var18;
  int _w;
  ulong uVar19;
  ulong uVar20;
  Option *pOVar21;
  ParamDict pd_5;
  ParamDict pd;
  Mat local_b8;
  ulong local_70;
  Option *local_68;
  long local_60;
  void *local_58;
  _func_int **local_50;
  ulong local_48;
  ModelBinFromMatArray local_40;
  
  pp_Var9 = this->_vptr_Deconvolution_x86_avx;
  p_Var14 = pp_Var9[-3];
  switch(*(undefined4 *)(&this->field_0x114 + (long)p_Var14)) {
  case 1:
    pLVar4 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    (*pLVar4->_vptr_Layer[2])(pLVar4,&pd);
    break;
  case 2:
    pLVar4 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)(&this->field_0x118 + (long)p_Var14));
    (*pLVar4->_vptr_Layer[2])(pLVar4,&pd);
    break;
  case 3:
    pLVar4 = create_layer(0x36);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)(&this->field_0x118 + (long)p_Var14));
    ParamDict::set(&pd,1,*(float *)(*(long *)(&this->field_0x118 + (long)p_Var14) + 4));
    (*pLVar4->_vptr_Layer[2])(pLVar4,&pd);
    break;
  case 4:
    pLVar4 = create_layer(0x1e);
    ParamDict::ParamDict(&pd);
    (*pLVar4->_vptr_Layer[2])(pLVar4,&pd);
    break;
  case 5:
    pLVar4 = create_layer(0x47);
    ParamDict::ParamDict(&pd);
    (*pLVar4->_vptr_Layer[2])(pLVar4,&pd);
    break;
  case 6:
    pLVar4 = create_layer(0x43);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)(&this->field_0x118 + (long)p_Var14));
    ParamDict::set(&pd,1,*(float *)(*(long *)(&this->field_0x118 + (long)p_Var14) + 4));
    (*pLVar4->_vptr_Layer[2])(pLVar4,&pd);
    break;
  default:
    pLVar4 = (Layer *)0x0;
    goto LAB_002643c3;
  }
  ParamDict::~ParamDict(&pd);
  (*pLVar4->_vptr_Layer[4])(pLVar4,opt);
  pp_Var9 = this->_vptr_Deconvolution_x86_avx;
LAB_002643c3:
  this->activation = pLVar4;
  p_Var14 = pp_Var9[-3];
  uVar19 = (long)*(int *)(&this->field_0xd8 + (long)p_Var14) *
           (long)*(int *)(&this->field_0xd4 + (long)p_Var14);
  uVar1 = *(uint *)(&this->field_0xd0 + (long)p_Var14);
  _w = (int)uVar19;
  uVar6 = (long)*(int *)(&this->field_0x110 + (long)p_Var14) / (long)_w;
  uVar6 = (long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) / (long)(int)uVar1;
  if (opt->use_packing_layout == true) {
    local_70 = (ulong)((uVar6 & 3) == 0) * 3 + 1;
    if ((uVar6 & 7) == 0) {
      local_70 = 8;
    }
    uVar7 = (ulong)((uVar1 & 3) == 0) * 3 + 1;
    if ((uVar1 & 7) == 0) {
      uVar7 = 8;
    }
  }
  else {
    local_70 = 1;
    uVar7 = 1;
  }
  _h = (int)uVar6;
  i_00 = (int)uVar7;
  local_68 = opt;
  if (opt->use_sgemm_convolution == true) {
    pLVar4 = create_layer(0x4a);
    this->gemm = pLVar4;
    ParamDict::ParamDict(&pd_5);
    ParamDict::set(&pd_5,2,1);
    ParamDict::set(&pd_5,3,0);
    ParamDict::set(&pd_5,4,1);
    ParamDict::set(&pd_5,5,0);
    ParamDict::set(&pd_5,6,1);
    ParamDict::set(&pd_5,7,*(int *)(&this->field_0xd0 + (long)this->_vptr_Deconvolution_x86_avx[-3])
                           * _w);
    ParamDict::set(&pd_5,8,0);
    ParamDict::set(&pd_5,9,_h);
    ParamDict::set(&pd_5,10,-1);
    ParamDict::set(&pd_5,0xb,0);
    ParamDict::set(&pd_5,0xc,i_00);
    (*this->gemm->_vptr_Layer[2])(this->gemm,&pd_5);
    pd._vptr_ParamDict = (_func_int **)0x0;
    iVar17 = 0;
    pd.d._4_4_ = 0;
    pd.d._0_4_ = iVar17;
    Mat::reshape(&local_b8,(Mat *)(&this->field_0x160 + (long)this->_vptr_Deconvolution_x86_avx[-3])
                 ,_w,_h,*(int *)&((Mat *)(&this->field_0x160 +
                                         (long)this->_vptr_Deconvolution_x86_avx[-3]))[-2].data,
                 (Allocator *)0x0);
    uVar10 = 0;
    Mat::create((Mat *)&pd,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_Deconvolution_x86_avx[-3]) * _w,_h,4,
                (Allocator *)0x0);
    pOVar21 = local_68;
    uVar8 = 0;
    if (0 < _w) {
      uVar8 = uVar19 & 0xffffffff;
    }
    pp_Var9 = this->_vptr_Deconvolution_x86_avx;
    uVar6 = uVar6 & 0xffffffff;
    if (_h < 1) {
      uVar6 = uVar10;
    }
    for (; uVar10 != uVar6; uVar10 = uVar10 + 1) {
      pp_Var11 = pd._vptr_ParamDict;
      for (lVar13 = 0;
          (long)((ulong)(i_00 - 1) + lVar13) < (long)*(int *)(&this->field_0xd0 + (long)pp_Var9[-3])
          ; lVar13 = lVar13 + uVar7) {
        pp_Var15 = (_func_int **)
                   (((long)local_b8.w * uVar10 + local_b8.cstep * lVar13) *
                    CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize) + (long)local_b8.data);
        for (uVar19 = 0; uVar16 = uVar7, pp_Var18 = pp_Var15, uVar19 != uVar8; uVar19 = uVar19 + 1)
        {
          while (uVar16 != 0) {
            *(undefined4 *)pp_Var11 = *(undefined4 *)pp_Var18;
            pp_Var11 = (_func_int **)((long)pp_Var11 + 4);
            uVar16 = uVar16 - 1;
            pp_Var18 = (_func_int **)
                       ((long)pp_Var18 +
                       local_b8.cstep * CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
          }
          pp_Var15 = (_func_int **)((long)pp_Var15 + 4);
        }
      }
    }
    piVar2 = (int *)CONCAT44(local_b8.refcount._4_4_,(int)local_b8.refcount);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_b8.allocator == (Allocator *)0x0) {
          free(local_b8.data);
        }
        else {
          (*(local_b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(pd.d._4_4_,(int)pd.d);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    local_b8.data = pd._vptr_ParamDict;
    local_b8.refcount._0_4_ = (int)pd.d;
    local_b8.refcount._4_4_ = pd.d._4_4_;
    local_b8.elemsize._0_4_ = 0;
    local_b8.elempack = 0;
    local_b8.allocator = (Allocator *)0x0;
    local_b8.dims = 0;
    local_b8.w = 0;
    local_b8.c = 0;
    local_b8.cstep = 0;
    pLVar4 = this->gemm;
    local_b8.elemsize._4_4_ = iVar17;
    local_b8.h = (int)local_b8.elemsize;
    local_b8.d = iVar17;
    ModelBinFromMatArray::ModelBinFromMatArray(&local_40,&local_b8);
    (*pLVar4->_vptr_Layer[3])(pLVar4,&local_40);
    ModelBinFromMatArray::~ModelBinFromMatArray(&local_40);
    (*this->gemm->_vptr_Layer[4])(this->gemm,pOVar21);
    piVar2 = (int *)CONCAT44(local_b8.refcount._4_4_,(int)local_b8.refcount);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_b8.allocator == (Allocator *)0x0) {
          free(local_b8.data);
        }
        else {
          (*(local_b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(pd.d._4_4_,(int)pd.d);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        free(pd._vptr_ParamDict);
      }
    }
    ParamDict::~ParamDict(&pd_5);
  }
  else {
    pd._vptr_ParamDict = (_func_int **)0x0;
    pd.d._0_4_ = 0;
    pd.d._4_4_ = 0;
    iVar17 = 0;
    Mat::create((Mat *)&pd,*(int *)(&this->field_0x18c + (long)p_Var14),4,(Allocator *)0x0);
    pp_Var9 = this->_vptr_Deconvolution_x86_avx;
    p_Var14 = pp_Var9[-3];
    lVar13 = *(long *)(&this->field_0x160 + (long)p_Var14);
    uVar8 = 0;
    if (0 < _w) {
      uVar8 = uVar19 & 0xffffffff;
    }
    pp_Var11 = pd._vptr_ParamDict;
    for (; iVar17 < *(int *)(&this->field_0xd0 + (long)p_Var14) * _h; iVar17 = iVar17 + 1) {
      iVar12 = _w;
      for (uVar10 = 0; iVar12 = iVar12 + -1, uVar8 != uVar10; uVar10 = uVar10 + 1) {
        *(undefined4 *)((long)pp_Var11 + (long)iVar12 * 4) = *(undefined4 *)(lVar13 + uVar10 * 4);
      }
      pp_Var11 = (_func_int **)((long)pp_Var11 + uVar19 * 4);
      p_Var14 = pp_Var9[-3];
      lVar13 = lVar13 + uVar19 * 4;
    }
    Mat::reshape(&local_b8,(Mat *)&pd,_w,_h,*(int *)(&this->field_0xd0 + (long)p_Var14),
                 (Allocator *)0x0);
    uVar19 = local_70;
    iVar17 = (int)local_70;
    Mat::create(&this->weight_data_tm,_w,
                (int)((long)((ulong)(uint)(_h >> 0x1f) << 0x20 | uVar6 & 0xffffffff) / (long)iVar17)
                ,*(int *)(&this->field_0xd0 + (long)this->_vptr_Deconvolution_x86_avx[-3]) / i_00,
                (ulong)(uint)(iVar17 * i_00 * 4),iVar17 * i_00,(Allocator *)0x0);
    pOVar21 = local_68;
    local_48 = (ulong)(i_00 - 1);
    local_50 = this->_vptr_Deconvolution_x86_avx;
    local_58 = (this->weight_data_tm).data;
    local_60 = (this->weight_data_tm).cstep * (this->weight_data_tm).elemsize;
    for (uVar6 = 0;
        (long)(local_48 + uVar6) < (long)*(int *)(&this->field_0xd0 + (long)local_50[-3]);
        uVar6 = uVar6 + uVar7) {
      puVar5 = (undefined4 *)((int)((uVar6 & 0xffffffff) / uVar7) * local_60 + (long)local_58);
      for (lVar13 = 0; lVar13 < (long)((long)_h - (ulong)(iVar17 - 1));
          lVar13 = lVar13 + (uVar19 & 0xffffffff)) {
        lVar3 = CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize);
        pp_Var9 = (_func_int **)
                  ((local_b8.w * lVar13 + uVar6 * local_b8.cstep) * lVar3 + (long)local_b8.data);
        for (uVar10 = 0; uVar10 != uVar8; uVar10 = uVar10 + 1) {
          pp_Var11 = pp_Var9;
          for (uVar16 = 0; pp_Var15 = pp_Var11, uVar20 = uVar7, uVar16 != (uVar19 & 0xffffffff);
              uVar16 = uVar16 + 1) {
            while (uVar20 != 0) {
              *puVar5 = *(undefined4 *)pp_Var15;
              puVar5 = puVar5 + 1;
              pp_Var15 = (_func_int **)((long)pp_Var15 + local_b8.cstep * lVar3);
              uVar20 = uVar20 - 1;
            }
            pp_Var11 = (_func_int **)((long)pp_Var11 + lVar3 * local_b8.w);
          }
          pp_Var9 = (_func_int **)((long)pp_Var9 + 4);
        }
      }
    }
    piVar2 = (int *)CONCAT44(local_b8.refcount._4_4_,(int)local_b8.refcount);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_b8.allocator == (Allocator *)0x0) {
          free(local_b8.data);
        }
        else {
          (*(local_b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(pd.d._4_4_,(int)pd.d);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        free(pd._vptr_ParamDict);
      }
    }
  }
  if (pOVar21->lightmode == true) {
    p_Var14 = this->_vptr_Deconvolution_x86_avx[-3];
    piVar2 = *(int **)(&this->field_0x168 + (long)p_Var14);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (*(long **)(&this->field_0x180 + (long)p_Var14) == (long *)0x0) {
          free(*(void **)(&this->field_0x160 + (long)p_Var14));
        }
        else {
          (**(code **)(**(long **)(&this->field_0x180 + (long)p_Var14) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x1a0 + (long)p_Var14) = 0;
    *(undefined8 *)(&this->field_0x16c + (long)p_Var14) = 0;
    *(undefined8 *)(&this->field_0x174 + (long)p_Var14) = 0;
    *(undefined8 *)(&this->field_0x160 + (long)p_Var14) = 0;
    *(undefined8 *)(&this->field_0x168 + (long)p_Var14) = 0;
    *(undefined8 *)(&this->field_0x188 + (long)p_Var14) = 0;
    *(undefined8 *)(&this->field_0x190 + (long)p_Var14) = 0;
    *(undefined4 *)(&this->field_0x198 + (long)p_Var14) = 0;
  }
  return 0;
}

Assistant:

int Deconvolution_x86_avx::create_pipeline(const Option& opt)
{
    activation = create_activation_layer(activation_type, activation_params, opt);

    const int maxk = kernel_w * kernel_h;
    int num_input = weight_data_size / maxk / num_output;

    int elempack = 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (opt.use_sgemm_convolution)
    {
        const int maxk = kernel_w * kernel_h;

        gemm = ncnn::create_layer(ncnn::LayerType::Gemm);

        ncnn::ParamDict pd;
        pd.set(2, 1);                 // transA
        pd.set(3, 0);                 // transB
        pd.set(4, 1);                 // constantA
        pd.set(5, 0);                 // constantB
        pd.set(6, 1);                 // constantC
        pd.set(7, maxk * num_output); // M = maxk*num_output
        pd.set(8, 0);                 // N = size
        pd.set(9, num_input);         // K = inch
        pd.set(10, -1);               // constant_broadcast_type_C = null
        pd.set(11, 0);                // output_N1M
        pd.set(12, out_elempack);

        gemm->load_param(pd);

        // maxk-inch-outch to pa-maxk-outch/pa-inch
        Mat tmp;
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

            tmp.create(maxk * num_output, num_input);

            for (int p = 0; p < num_input; p += 1)
            {
                float* g00 = tmp.row(p);

                for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        for (int i = 0; i < out_elempack; i++)
                        {
                            const float* k00 = weight_data_r2.channel(q + i).row(p);
                            g00[0] = k00[k];
                            g00++;
                        }
                    }
                }
            }
        }

        ncnn::Mat weights[1];
        weights[0] = tmp;

        gemm->load_model(ModelBinFromMatArray(weights));

        gemm->create_pipeline(opt);
    }
    else
    {
        Mat weight_data_transposed(weight_data.w);
        {
            float* pt = weight_data_transposed;
            const float* p = weight_data;

            for (int i = 0; i < num_input * num_output; i++)
            {
                for (int k = 0; k < maxk; k++)
                {
                    pt[maxk - 1 - k] = p[k];
                }

                p += maxk;
                pt += maxk;
            }
        }

        // src = kw-kh-inch-outch
        // dst = pb-pa-kw-kh-inch/pa-outch/pb
        Mat weight_data_r2 = weight_data_transposed.reshape(maxk, num_input, num_output);

        weight_data_tm.create(maxk, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            float* g00 = weight_data_tm.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                for (int k = 0; k < maxk; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}